

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O1

void __thiscall Am_Value_List::Delete(Am_Value_List *this,bool unique)

{
  undefined1 *puVar1;
  Am_Value_List_Data *pAVar2;
  Am_List_Item *pAVar3;
  int iVar4;
  undefined4 extraout_var;
  Am_List_Item *pAVar5;
  Am_List_Item **ppAVar6;
  
  if ((this->item != (Am_List_Item *)0x0) &&
     (pAVar2 = this->data, pAVar2 != (Am_Value_List_Data *)0x0)) {
    if ((unique) && ((pAVar2->super_Am_Wrapper).refs != 1)) {
      iVar4 = (*(pAVar2->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[5])();
      pAVar5 = this->item;
      if (pAVar5 != (Am_List_Item *)0x0) {
        ppAVar6 = &((Am_Value_List_Data *)CONCAT44(extraout_var,iVar4))->head;
        do {
          pAVar5 = pAVar5->prev;
          pAVar3 = *ppAVar6;
          ppAVar6 = &pAVar3->next;
        } while (pAVar5 != (Am_List_Item *)0x0);
        this->item = pAVar3;
      }
      this->data = (Am_Value_List_Data *)CONCAT44(extraout_var,iVar4);
    }
    pAVar5 = this->item;
    pAVar3 = pAVar5->prev;
    ppAVar6 = &pAVar3->next;
    if (pAVar3 == (Am_List_Item *)0x0) {
      ppAVar6 = &this->data->head;
    }
    *ppAVar6 = pAVar5->next;
    ppAVar6 = &pAVar5->next->prev;
    if (pAVar5->next == (Am_List_Item *)0x0) {
      ppAVar6 = &this->data->tail;
    }
    *ppAVar6 = pAVar3;
    pAVar3 = pAVar5->prev;
    if (pAVar5 != (Am_List_Item *)0x0) {
      Am_Value::~Am_Value(&pAVar5->super_Am_Value);
      operator_delete(pAVar5);
    }
    this->item = pAVar3;
    puVar1 = &(this->data->super_Am_Wrapper).field_0xc;
    *(short *)puVar1 = *(short *)puVar1 + -1;
    return;
  }
  Am_Error("** Am_Value_List::Delete: no item is current\n");
}

Assistant:

void
Am_Value_List::Delete(bool unique)
{
  if (item && data) {
    if (unique)
      data->Make_Unique(data, item);
    if (item->prev)
      item->prev->next = item->next;
    else
      data->head = item->next;
    if (item->next)
      item->next->prev = item->prev;
    else
      data->tail = item->prev;
    Am_List_Item *new_item;
    new_item = item->prev;
    delete item;
    item = new_item;
    --data->number;
  } else
    Am_Error("** Am_Value_List::Delete: no item is current\n");
}